

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int exprMightBeIndexed2(SrcList *pFrom,int *aiCurCol,Expr *pExpr,int j)

{
  Expr *pExpr_00;
  int iVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  Index *pIVar5;
  long lVar6;
  long in_FS_OFFSET;
  Walker local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = (long)j;
  do {
    pIVar5 = (pFrom->a[lVar3].pSTab)->pIndex;
    if (pIVar5 != (Index *)0x0) {
      iVar2 = pFrom->a[lVar3].iCursor;
      do {
        if ((pIVar5->aColExpr != (ExprList *)0x0) && (pIVar5->nKeyCol != 0)) {
          lVar6 = 4;
          uVar4 = 0;
          do {
            if (pIVar5->aiColumn[uVar4] == -2) {
              iVar1 = sqlite3ExprCompareSkip
                                (pExpr,*(Expr **)((long)pIVar5->aColExpr->a + lVar6 * 2 + -8),iVar2)
              ;
              if (iVar1 == 0) {
                pExpr_00 = *(Expr **)((long)pIVar5->aColExpr->a + lVar6 * 2 + -8);
                local_68.u.pNC = (NameContext *)&DAT_aaaaaaaaaaaaaaaa;
                local_68.xSelectCallback2 =
                     (_func_void_Walker_ptr_Select_ptr *)&DAT_aaaaaaaaaaaaaaaa;
                local_68.walkerDepth = -0x55555556;
                local_68.eCode = 1;
                local_68.mWFlags = 0xaaaa;
                local_68.pParse = (Parse *)0x0;
                local_68.xExprCallback = exprNodeIsConstant;
                local_68.xSelectCallback = sqlite3SelectWalkFail;
                if (pExpr_00 != (Expr *)0x0) {
                  sqlite3WalkExprNN(&local_68,pExpr_00);
                  if (local_68.eCode == 0) {
                    *aiCurCol = iVar2;
                    aiCurCol[1] = -2;
                    iVar2 = 1;
                    goto LAB_00199edf;
                  }
                }
              }
            }
            uVar4 = uVar4 + 1;
            lVar6 = lVar6 + 0xc;
          } while (uVar4 < pIVar5->nKeyCol);
        }
        pIVar5 = pIVar5->pNext;
      } while (pIVar5 != (Index *)0x0);
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 < pFrom->nSrc);
  iVar2 = 0;
LAB_00199edf:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

static SQLITE_NOINLINE int exprMightBeIndexed2(
  SrcList *pFrom,        /* The FROM clause */
  int *aiCurCol,         /* Write the referenced table cursor and column here */
  Expr *pExpr,           /* An operand of a comparison operator */
  int j                  /* Start looking with the j-th pFrom entry */
){
  Index *pIdx;
  int i;
  int iCur;
  do{
    iCur = pFrom->a[j].iCursor;
    for(pIdx=pFrom->a[j].pSTab->pIndex; pIdx; pIdx=pIdx->pNext){
      if( pIdx->aColExpr==0 ) continue;
      for(i=0; i<pIdx->nKeyCol; i++){
        if( pIdx->aiColumn[i]!=XN_EXPR ) continue;
        assert( pIdx->bHasExpr );
        if( sqlite3ExprCompareSkip(pExpr,pIdx->aColExpr->a[i].pExpr,iCur)==0
         && !sqlite3ExprIsConstant(0,pIdx->aColExpr->a[i].pExpr)
        ){
          aiCurCol[0] = iCur;
          aiCurCol[1] = XN_EXPR;
          return 1;
        }
      }
    }
  }while( ++j < pFrom->nSrc );
  return 0;
}